

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP.h
# Opt level: O2

void __thiscall ASDCP::TimedText::FrameBuffer::FrameBuffer(FrameBuffer *this)

{
  ASDCP::FrameBuffer::FrameBuffer(&this->super_FrameBuffer);
  *(undefined ***)this = &PTR__FrameBuffer_00114d10;
  (this->m_MIMEType)._M_dataplus._M_p = (pointer)&(this->m_MIMEType).field_2;
  (this->m_MIMEType)._M_string_length = 0;
  (this->m_MIMEType).field_2._M_local_buf[0] = '\0';
  this->m_AssetID[0] = '\0';
  this->m_AssetID[1] = '\0';
  this->m_AssetID[2] = '\0';
  this->m_AssetID[3] = '\0';
  this->m_AssetID[4] = '\0';
  this->m_AssetID[5] = '\0';
  this->m_AssetID[6] = '\0';
  this->m_AssetID[7] = '\0';
  this->m_AssetID[8] = '\0';
  this->m_AssetID[9] = '\0';
  this->m_AssetID[10] = '\0';
  this->m_AssetID[0xb] = '\0';
  this->m_AssetID[0xc] = '\0';
  this->m_AssetID[0xd] = '\0';
  this->m_AssetID[0xe] = '\0';
  this->m_AssetID[0xf] = '\0';
  return;
}

Assistant:

FrameBuffer() { memset(m_AssetID, 0, UUIDlen); }